

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O1

void __thiscall ON_PostEffects::CImpl::Populate(CImpl *this,Types type)

{
  ON_PostEffects *pe;
  bool bVar1;
  int iVar2;
  ON_XMLNode *pOVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar4;
  undefined4 extraout_var_01;
  ON_PostEffect *this_00;
  wchar_t *pwVar5;
  ON_UUID OVar6;
  ON_wString local_name;
  ChildIterator it;
  ON_UUID id;
  ON_PostEffect *local_60;
  ON_wString local_58;
  ChildIterator local_50;
  ON_UUID local_40;
  
  pOVar3 = PostEffectsNode(this);
  pOVar3 = GetPostEffectTypeNode(pOVar3,type);
  if (pOVar3 != (ON_XMLNode *)0x0) {
    (*pOVar3->_vptr_ON_XMLNode[0x2c])(&local_50,pOVar3);
    pOVar3 = ON_XMLNode::ChildIterator::GetNextChild(&local_50);
    while (pOVar3 != (ON_XMLNode *)0x0) {
      iVar2 = (*pOVar3->_vptr_ON_XMLNode[3])(pOVar3);
      bVar1 = ::operator==((ON_wString *)CONCAT44(extraout_var,iVar2),L"plug-in");
      if (bVar1) {
        iVar2 = (*pOVar3->_vptr_ON_XMLNode[0x26])(pOVar3,L"name");
        plVar4 = (long *)CONCAT44(extraout_var_00,iVar2);
        if (plVar4 != (long *)0x0) {
          plVar4 = (long *)(**(code **)(*plVar4 + 0x38))(plVar4);
          (**(code **)(*plVar4 + 0x168))(&local_58,plVar4);
          iVar2 = (*pOVar3->_vptr_ON_XMLNode[0x26])(pOVar3,L"id");
          plVar4 = (long *)CONCAT44(extraout_var_01,iVar2);
          if (plVar4 != (long *)0x0) {
            plVar4 = (long *)(**(code **)(*plVar4 + 0x38))(plVar4);
            OVar6 = (ON_UUID)(**(code **)(*plVar4 + 0x138))(plVar4);
            local_40 = OVar6;
            this_00 = (ON_PostEffect *)operator_new(0x10);
            pe = this->_pe;
            pwVar5 = ON_wString::operator_cast_to_wchar_t_(&local_58);
            ON_PostEffect::ON_PostEffect(this_00,pe,type,&local_40,pwVar5);
            local_60 = this_00;
            ON_SimpleArray<ON_PostEffect_*>::Append(&this->_peps,&local_60);
          }
          ON_wString::~ON_wString(&local_58);
        }
      }
      pOVar3 = ON_XMLNode::ChildIterator::GetNextChild(&local_50);
    }
    ON_XMLNode::ChildIterator::~ChildIterator(&local_50);
  }
  return;
}

Assistant:

void ON_PostEffects::CImpl::Populate(ON_PostEffect::Types type) const
{
  const ON_XMLNode* pep_type_node = GetPostEffectTypeNode(PostEffectsNode(), type);
  if (nullptr == pep_type_node)
    return;

  auto it = pep_type_node->GetChildIterator();

  ON_XMLNode* pep_node = it.GetNextChild();
  while (nullptr != pep_node)
  {
    if (pep_node->TagName() == ON_RDK_PEP_PLUG_IN)
    {
      ON_XMLProperty* prop_name = pep_node->GetNamedProperty(ON_RDK_PEP_LOCAL_NAME);
      if (nullptr != prop_name)
      {
        const ON_wString local_name = prop_name->GetValue().AsString();

        ON_XMLProperty* prop_id = pep_node->GetNamedProperty(ON_RDK_PEP_ID);
        if (nullptr != prop_id)
        {
          const ON_UUID id = prop_id->GetValue().AsUuid();
          _peps.Append(new ON_PostEffect(_pe, type, id, local_name));
        }
      }
    }

    pep_node = it.GetNextChild();
  }
}